

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O3

shared_ptr<MainLoop> MainLoop::Init(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  MainLoop *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *in_RDI;
  shared_ptr<MainLoop> sVar2;
  
  if (__MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    _Var1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    (_Var1._M_pi)->_M_use_count = 1;
    (_Var1._M_pi)->_M_weak_count = 1;
    (_Var1._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00106cb8;
    __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(_Var1._M_pi + 1);
    *(undefined4 *)&_Var1._M_pi[1]._vptr__Sp_counted_base = 0x3dcccccd;
    this = __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (__MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var1._M_pi;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
      in_RDX._M_pi = extraout_RDX_00;
      goto LAB_0010345f;
    }
    __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var1._M_pi;
    *(element_type **)in_RDI =
         __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RDI + 2) = _Var1._M_pi;
    in_RDX._M_pi = extraout_RDX;
  }
  else {
LAB_0010345f:
    _Var1._M_pi = __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    *(element_type **)in_RDI =
         __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RDI + 2) = _Var1._M_pi;
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00103490;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
  }
LAB_00103490:
  sVar2.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar2.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<MainLoop>)sVar2.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MainLoop> MainLoop::Init()
{
	if (__MainLoop__ == NULL)
	{
		__MainLoop__ = std::make_shared<MainLoop>();
	}
	return __MainLoop__;
}